

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetScrollHereY(float center_y_ratio)

{
  ImGuiWindow *pIVar1;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  float target_pos_y;
  float spacing_y;
  ImGuiWindow *window;
  ImGuiContext *g;
  float in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  
  pIVar1 = GImGui->CurrentWindow;
  fVar3 = (GImGui->Style).ItemSpacing.y;
  fVar2 = ImLerp<float>((pIVar1->DC).CursorPosPrevLine.y - fVar3,
                        (pIVar1->DC).CursorPosPrevLine.y + (pIVar1->DC).PrevLineSize.y + fVar3,
                        in_XMM0_Da);
  SetScrollFromPosY((ImGuiWindow *)CONCAT44(fVar3,fVar2),in_stack_ffffffffffffffdc,
                    in_stack_ffffffffffffffd8);
  fVar3 = ImMax<float>(0.0,(pIVar1->WindowPadding).y - fVar3);
  (pIVar1->ScrollTargetEdgeSnapDist).y = fVar3;
  return;
}

Assistant:

void ImGui::SetScrollHereY(float center_y_ratio)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float spacing_y = g.Style.ItemSpacing.y;
    float target_pos_y = ImLerp(window->DC.CursorPosPrevLine.y - spacing_y, window->DC.CursorPosPrevLine.y + window->DC.PrevLineSize.y + spacing_y, center_y_ratio);
    SetScrollFromPosY(window, target_pos_y - window->Pos.y, center_y_ratio); // Convert from absolute to local pos

    // Tweak: snap on edges when aiming at an item very close to the edge
    window->ScrollTargetEdgeSnapDist.y = ImMax(0.0f, window->WindowPadding.y - spacing_y);
}